

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

void __thiscall Connection::fill_fd_set(Connection *this,fd_set *rdfds,fd_set *wrfds)

{
  int iVar1;
  fd_set *wrfds_local;
  fd_set *rdfds_local;
  Connection *this_local;
  
  if (this->data_c_f_ == 0) {
    iVar1 = this->client_socket_ / 0x40;
    rdfds->fds_bits[iVar1] =
         1L << ((byte)((long)this->client_socket_ % 0x40) & 0x3f) | rdfds->fds_bits[iVar1];
  }
  if (this->data_f_c_ == 0) {
    iVar1 = this->forwarding_socket_ / 0x40;
    rdfds->fds_bits[iVar1] =
         1L << ((byte)((long)this->forwarding_socket_ % 0x40) & 0x3f) | rdfds->fds_bits[iVar1];
  }
  if (0 < this->data_c_f_) {
    iVar1 = this->forwarding_socket_ / 0x40;
    wrfds->fds_bits[iVar1] =
         1L << ((byte)((long)this->forwarding_socket_ % 0x40) & 0x3f) | wrfds->fds_bits[iVar1];
  }
  if (0 < this->data_f_c_) {
    iVar1 = this->client_socket_ / 0x40;
    wrfds->fds_bits[iVar1] =
         1L << ((byte)((long)this->client_socket_ % 0x40) & 0x3f) | wrfds->fds_bits[iVar1];
  }
  return;
}

Assistant:

void Connection::fill_fd_set(fd_set &rdfds, fd_set &wrfds) {
    if (data_c_f_ == 0) {
        FD_SET(client_socket_, &rdfds);
    }
    if (data_f_c_ == 0) {
        FD_SET(forwarding_socket_, &rdfds);
    }
    if (data_c_f_ > 0) {
        FD_SET(forwarding_socket_, &wrfds);
    }
    if (data_f_c_ > 0) {
        FD_SET(client_socket_, &wrfds);
    }
}